

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_feature_merger.cc
# Opt level: O2

base_learner * VW::shared_feature_merger::shared_feature_merger_setup(options_i *options,vw *all)

{
  bool bVar1;
  base_learner *l;
  multi_learner *base;
  learner<VW::shared_feature_merger::sfm_data,_std::vector<example_*,_std::allocator<example_*>_>_>
  *plVar2;
  free_ptr<VW::shared_feature_merger::sfm_data> data;
  
  bVar1 = use_reduction(options);
  if (bVar1) {
    data._M_t.super___uniq_ptr_impl<VW::shared_feature_merger::sfm_data,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_VW::shared_feature_merger::sfm_data_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_VW::shared_feature_merger::sfm_data_*,_false>._M_head_impl =
         calloc_or_throw<VW::shared_feature_merger::sfm_data>(1);
    data._M_t.super___uniq_ptr_impl<VW::shared_feature_merger::sfm_data,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_VW::shared_feature_merger::sfm_data_*,_void_(*)(void_*)>.
    super__Tuple_impl<1UL,_void_(*)(void_*)>.super__Head_base<1UL,_void_(*)(void_*),_false>.
    _M_head_impl = (_Head_base<1UL,_void_(*)(void_*),_false>)
                   destroy_free<VW::shared_feature_merger::sfm_data>;
    l = setup_base(options,all);
    base = LEARNER::as_multiline<char,char>(l);
    plVar2 = LEARNER::
             init_learner<VW::shared_feature_merger::sfm_data,std::vector<example*,std::allocator<example*>>,LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                       (&data,base,predict_or_learn<true>,predict_or_learn<false>);
    std::unique_ptr<VW::shared_feature_merger::sfm_data,_void_(*)(void_*)>::~unique_ptr(&data);
  }
  else {
    plVar2 = (learner<VW::shared_feature_merger::sfm_data,_std::vector<example_*,_std::allocator<example_*>_>_>
              *)0x0;
  }
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* shared_feature_merger_setup(config::options_i& options, vw& all)
{
  if (!use_reduction(options))
    return nullptr;

  auto data = scoped_calloc_or_throw<sfm_data>();

  auto* base = LEARNER::as_multiline(setup_base(options, all));
  auto& learner = LEARNER::init_learner(data, base, predict_or_learn<true>, predict_or_learn<false>);

  // TODO: Incorrect feature numbers will be reported without merging the example namespaces from the
  //       shared example in a finish_example function. However, its too expensive to perform the full operation.

  return LEARNER::make_base(learner);
}